

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleARGBFilterCols64_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x32,int dx)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)x32;
  if (1 < dst_width) {
    iVar5 = 0;
    do {
      uVar6 = (uint)(uVar8 >> 9) & 0x7f;
      uVar1 = *(uint *)(src_argb + ((long)uVar8 >> 0x10) * 4);
      uVar2 = *(uint *)(src_argb + ((long)uVar8 >> 0x10) * 4 + 4);
      uVar7 = uVar6 ^ 0x7f;
      *(uint *)dst_argb =
           (uVar2 & 0xff) * uVar6 + (uVar1 & 0xff) * uVar7 >> 7 |
           ((uVar2 >> 0x18) * uVar6 + (uVar1 >> 0x18) * uVar7 & 0xffffff80) << 0x11 |
           ((uVar2 >> 0x10 & 0xff) * uVar6 + (uVar1 >> 0x10 & 0xff) * uVar7) * 0x200 & 0x1ff0000 |
           ((uVar2 >> 8 & 0xff) * uVar6 + (uVar1 >> 8 & 0xff) * uVar7) * 2 & 0x1ff00;
      lVar3 = uVar8 + (long)dx;
      lVar4 = lVar3 >> 0x10;
      uVar6 = (uint)((int)uVar8 + dx) >> 9 & 0x7f;
      uVar1 = *(uint *)(src_argb + lVar4 * 4);
      uVar2 = *(uint *)(src_argb + lVar4 * 4 + 4);
      uVar7 = uVar6 ^ 0x7f;
      *(uint *)((long)dst_argb + 4) =
           (uVar2 & 0xff) * uVar6 + (uVar1 & 0xff) * uVar7 >> 7 |
           ((uVar2 >> 0x18) * uVar6 + (uVar1 >> 0x18) * uVar7 & 0xffffff80) << 0x11 |
           ((uVar2 >> 0x10 & 0xff) * uVar6 + (uVar1 >> 0x10 & 0xff) * uVar7) * 0x200 & 0x1ff0000 |
           ((uVar2 >> 8 & 0xff) * uVar6 + (uVar1 >> 8 & 0xff) * uVar7) * 2 & 0x1ff00;
      uVar8 = lVar3 + dx;
      dst_argb = (uint8_t *)((long)dst_argb + 8);
      iVar5 = iVar5 + 2;
    } while (iVar5 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    uVar6 = (uint)(uVar8 >> 9) & 0x7f;
    uVar1 = *(uint *)(src_argb + ((long)uVar8 >> 0x10) * 4);
    uVar2 = *(uint *)(src_argb + ((long)uVar8 >> 0x10) * 4 + 4);
    uVar7 = uVar6 ^ 0x7f;
    *(uint *)dst_argb =
         (uVar2 & 0xff) * uVar6 + (uVar1 & 0xff) * uVar7 >> 7 |
         ((uVar2 >> 0x18) * uVar6 + (uVar1 >> 0x18) * uVar7 & 0xffffff80) << 0x11 |
         ((uVar2 >> 0x10 & 0xff) * uVar6 + (uVar1 >> 0x10 & 0xff) * uVar7 & 0xff80) << 9 |
         ((uVar2 >> 8 & 0xff) * uVar6 + (uVar1 >> 8 & 0xff) * uVar7) * 2 & 0x1ff00;
  }
  return;
}

Assistant:

void ScaleARGBFilterCols64_C(uint8_t* dst_argb,
                             const uint8_t* src_argb,
                             int dst_width,
                             int x32,
                             int dx) {
  int64_t x = (int64_t)(x32);
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}